

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2edge_crosser.h
# Opt level: O0

int __thiscall S2CopyingEdgeCrosser::CrossingSign(S2CopyingEdgeCrosser *this,S2Point *c,S2Point *d)

{
  bool bVar1;
  int iVar2;
  S2Point *d_local;
  S2Point *c_local;
  S2CopyingEdgeCrosser *this_local;
  
  bVar1 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator!=
                    ((BasicVector<Vector3,_double,_3UL> *)c,&this->c_);
  if ((bVar1) || ((this->crosser_).c_ == (S2Point *)0x0)) {
    RestartAt(this,c);
  }
  iVar2 = CrossingSign(this,d);
  return iVar2;
}

Assistant:

inline int S2CopyingEdgeCrosser::CrossingSign(const S2Point& c,
                                              const S2Point& d) {
  if (c != c_ || crosser_.c_ == nullptr) RestartAt(c);
  return CrossingSign(d);
}